

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O2

void __thiscall skiwi::anon_unknown_23::minmax_test::test(minmax_test *this)

{
  int in_R8D;
  int iVar1;
  allocator<char> local_12e9;
  string local_12e8;
  string local_12c8;
  string local_12a8;
  string local_1288;
  string local_1268;
  string local_1248;
  string local_1228;
  string local_1208;
  string local_11e8;
  string local_11c8;
  string local_11a8;
  string local_1188;
  string local_1168;
  string local_1148;
  string local_1128;
  string local_1108;
  string local_10e8;
  string local_10c8;
  string local_10a8;
  string local_1088;
  string local_1068;
  string local_1048;
  string local_1028;
  string local_1008;
  string local_fe8;
  string local_fc8;
  string local_fa8;
  string local_f88;
  string local_f68;
  string local_f48;
  string local_f28;
  string local_f08;
  string local_ee8;
  string local_ec8;
  string local_ea8;
  string local_e88;
  string local_e68;
  string local_e48;
  string local_e28;
  string local_e08;
  string local_de8;
  string local_dc8;
  string local_da8;
  string local_d88;
  string local_d68;
  string local_d48;
  string local_d28;
  string local_d08;
  string local_ce8;
  string local_cc8;
  string local_ca8;
  string local_c88;
  string local_c68;
  string local_c48;
  string local_c28;
  string local_c08;
  string local_be8;
  string local_bc8;
  string local_ba8;
  string local_b88;
  string local_b68;
  string local_b48;
  string local_b28;
  string local_b08;
  string local_ae8;
  string local_ac8;
  string local_aa8;
  string local_a88;
  string local_a68;
  string local_a48;
  string local_a28;
  string local_a08;
  string local_9e8;
  string local_9c8;
  string local_9a8;
  string local_988;
  string local_968;
  string local_948;
  string local_928;
  string local_908;
  string local_8e8;
  string local_8c8;
  string local_8a8;
  string local_888;
  string local_868;
  string local_848;
  string local_828;
  string local_808;
  string local_7e8;
  string local_7c8;
  string local_7a8;
  string local_788;
  string local_768;
  string local_748;
  string local_728;
  string local_708;
  string local_6e8;
  string local_6c8;
  string local_6a8;
  string local_688;
  string local_668;
  string local_648;
  string local_628;
  string local_608;
  string local_5e8;
  string local_5c8;
  string local_5a8;
  string local_588;
  string local_568;
  string local_548;
  string local_528;
  string local_508;
  string local_4e8;
  string local_4c8;
  string local_4a8;
  string local_488;
  string local_468;
  string local_448;
  string local_428;
  string local_408;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  string local_388;
  string local_368;
  string local_348;
  string local_328;
  string local_308;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  string local_28;
  
  compile_fixture::build_libs(&this->super_compile_fixture);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_12e8,"(max 1)",&local_12e9);
  compile_fixture::run(&local_28,&this->super_compile_fixture,&local_12e8,true,in_R8D);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_28,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xe9b,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_12e8,"(min 2)",&local_12e9);
  compile_fixture::run(&local_48,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("2",&local_48,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xe9c,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_12e8,"(max 1.5)",&local_12e9);
  compile_fixture::run(&local_68,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("1.5",&local_68,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xe9d,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_12e8,"(min 2.2)",&local_12e9);
  compile_fixture::run(&local_88,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("2.2",&local_88,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xe9e,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(max 1.0 2.0)",&local_12e9);
  compile_fixture::run(&local_a8,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("2",&local_a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xe9f,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(max 1.0 2.0 -0.4 7.2 2.3 7.1 -11.0)",&local_12e9);
  compile_fixture::run(&local_c8,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("7.2",&local_c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xea0,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(max 1 2.0)",&local_12e9);
  compile_fixture::run(&local_e8,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("2",&local_e8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xea1,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(max 1.0 2)",&local_12e9);
  compile_fixture::run(&local_108,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("2",&local_108,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xea2,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_12e8,"(max 1 2)",&local_12e9);
  compile_fixture::run(&local_128,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("2",&local_128,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xea3,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(max 1 2 7 -3 -11 6 3)",&local_12e9);
  compile_fixture::run(&local_148,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("7",&local_148,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xea4,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(min 1.0 2.0)",&local_12e9);
  compile_fixture::run(&local_168,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_168,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xea6,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(min 1.0 2.0 -0.4 7.2 2.3 7.1 -11.0)",&local_12e9);
  compile_fixture::run(&local_188,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("-11",&local_188,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xea7,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(min 1 2.0)",&local_12e9);
  compile_fixture::run(&local_1a8,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xea8,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(min 1.0 2)",&local_12e9);
  compile_fixture::run(&local_1c8,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_1c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xea9,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_12e8,"(min 1 2)",&local_12e9);
  compile_fixture::run(&local_1e8,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_1e8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xeaa,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(min 1 2 7 -3 -11 6 3)",&local_12e9);
  compile_fixture::run(&local_208,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("-11",&local_208,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xeab,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(arithmetic-shift 1 10)",&local_12e9);
  compile_fixture::run(&local_228,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("1024",&local_228,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xeac,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(arithmetic-shift 255 -3)",&local_12e9);
  compile_fixture::run(&local_248,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("31",&local_248,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xead,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(quotient 10 3)",&local_12e9);
  compile_fixture::run(&local_268,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_268,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xeaf,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(quotient -10 3)",&local_12e9);
  compile_fixture::run(&local_288,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("-3",&local_288,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xeb0,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(quotient 10.0 3)",&local_12e9);
  compile_fixture::run(&local_2a8,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_2a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xeb1,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(quotient -10.0 3)",&local_12e9);
  compile_fixture::run(&local_2c8,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("-3",&local_2c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xeb2,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(quotient 10.0 3.0)",&local_12e9);
  compile_fixture::run(&local_2e8,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_2e8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xeb3,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(quotient -10.0 3.0)",&local_12e9);
  compile_fixture::run(&local_308,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("-3",&local_308,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xeb4,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(quotient 10 3.0)",&local_12e9);
  compile_fixture::run(&local_328,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_328,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xeb5,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(quotient -10 3.0)",&local_12e9);
  compile_fixture::run(&local_348,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("-3",&local_348,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xeb6,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(remainder 10 3)",&local_12e9);
  compile_fixture::run(&local_368,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_368,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xeb8,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(remainder -10 3)",&local_12e9);
  compile_fixture::run(&local_388,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("-1",&local_388,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xeb9,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_388);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(remainder 10.0 3)",&local_12e9);
  compile_fixture::run(&local_3a8,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_3a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xeba,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_3a8);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(remainder -10.0 3)",&local_12e9);
  compile_fixture::run(&local_3c8,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("-1",&local_3c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xebb,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(remainder 10.0 3.0)",&local_12e9);
  compile_fixture::run(&local_3e8,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_3e8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xebc,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(remainder -10.0 3.0)",&local_12e9);
  compile_fixture::run(&local_408,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("-1",&local_408,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xebd,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_408);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(remainder 10 3.0)",&local_12e9);
  compile_fixture::run(&local_428,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_428,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xebe,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_428);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(remainder -10 3.0)",&local_12e9);
  compile_fixture::run(&local_448,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("-1",&local_448,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xebf,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_448);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,
             "(let ([a 1324] [b 324]) (= (+ (* (quotient a b) b)  (remainder a b) )  a)  )",
             &local_12e9);
  compile_fixture::run(&local_468,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_468,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xec2,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_468);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,
             "(let ([a 1324] [b -324.0]) (= (+ (* (quotient a b) b)  (remainder a b) )  a)  )",
             &local_12e9);
  compile_fixture::run(&local_488,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_488,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xec3,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_488);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(let ([a 1324] [b -324.0]) (quotient a b ))",&local_12e9);
  compile_fixture::run(&local_4a8,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("-4",&local_4a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xec4,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_4a8);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(let ([a 1324] [b -324.0]) (remainder a b ))",&local_12e9);
  compile_fixture::run(&local_4c8,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("28",&local_4c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xec5,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,
             "(let ([a 1324] [b -324.0]) (+ (* (quotient a b) b)  (remainder a b) ))",&local_12e9);
  compile_fixture::run(&local_4e8,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("1324",&local_4e8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xec6,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(modulo 10 3)",&local_12e9);
  compile_fixture::run(&local_508,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_508,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xec8,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_508);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(modulo -10 3)",&local_12e9);
  compile_fixture::run(&local_528,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("2",&local_528,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xec9,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_528);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(modulo 10.0 3)",&local_12e9);
  compile_fixture::run(&local_548,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_548,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xeca,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_548);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(modulo -10.0 -3)",&local_12e9);
  compile_fixture::run(&local_568,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("-1",&local_568,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xecb,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_568);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(modulo 10.0 3.0)",&local_12e9);
  compile_fixture::run(&local_588,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_588,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xecc,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_588);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(modulo -10.0 3.0)",&local_12e9);
  compile_fixture::run(&local_5a8,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("2",&local_5a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xecd,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_5a8);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(modulo 10 -3.0)",&local_12e9);
  compile_fixture::run(&local_5c8,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("-2",&local_5c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xece,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_5c8);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(modulo -10 3.0)",&local_12e9);
  compile_fixture::run(&local_5e8,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("2",&local_5e8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xecf,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_5e8);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_12e8,"(abs 3)",&local_12e9);
  compile_fixture::run(&local_608,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_608,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xed1,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_608);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_12e8,"(abs 3.2)",&local_12e9);
  compile_fixture::run(&local_628,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("3.2",&local_628,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xed2,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_628);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_12e8,"(abs -3)",&local_12e9);
  compile_fixture::run(&local_648,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_648,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xed3,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_648);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_12e8,"(abs -3.2)",&local_12e9)
  ;
  compile_fixture::run(&local_668,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("3.2",&local_668,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xed4,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_668);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_12e8,"(abs 0)",&local_12e9);
  compile_fixture::run(&local_688,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("0",&local_688,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xed5,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_688);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_12e8,"(abs 0.0)",&local_12e9);
  compile_fixture::run(&local_6a8,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("0",&local_6a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xed6,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_6a8);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(flonum->fixnum 3.143)",&local_12e9);
  compile_fixture::run(&local_6c8,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_6c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xed8,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_6c8);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(flonum->fixnum -3.143)",&local_12e9);
  compile_fixture::run(&local_6e8,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("-3",&local_6e8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xed9,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_6e8);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(fixnum->flonum 3)",&local_12e9);
  compile_fixture::run(&local_708,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_708,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xedb,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_708);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(flonum? (fixnum->flonum 3))",&local_12e9);
  compile_fixture::run(&local_728,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0xedc;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_728,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xedc,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_728);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_12e8,"(max 1)",&local_12e9);
  compile_fixture::run_optimized(&local_748,&this->super_compile_fixture,&local_12e8,iVar1);
  iVar1 = 0xede;
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_748,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xede,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_748);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_12e8,"(min 2)",&local_12e9);
  compile_fixture::run_optimized(&local_768,&this->super_compile_fixture,&local_12e8,iVar1);
  iVar1 = 0xedf;
  TestEq<char_const*,std::__cxx11::string>
            ("2",&local_768,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xedf,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_768);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_12e8,"(max 1.5)",&local_12e9);
  compile_fixture::run_optimized(&local_788,&this->super_compile_fixture,&local_12e8,iVar1);
  iVar1 = 0xee0;
  TestEq<char_const*,std::__cxx11::string>
            ("1.5",&local_788,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xee0,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_788);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_12e8,"(min 2.2)",&local_12e9);
  compile_fixture::run_optimized(&local_7a8,&this->super_compile_fixture,&local_12e8,iVar1);
  iVar1 = 0xee1;
  TestEq<char_const*,std::__cxx11::string>
            ("2.2",&local_7a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xee1,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_7a8);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(max 1.0 2.0)",&local_12e9);
  compile_fixture::run_optimized(&local_7c8,&this->super_compile_fixture,&local_12e8,iVar1);
  iVar1 = 0xee2;
  TestEq<char_const*,std::__cxx11::string>
            ("2",&local_7c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xee2,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_7c8);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(max 1.0 2.0 -0.4 7.2 2.3 7.1 -11.0)",&local_12e9);
  compile_fixture::run_optimized(&local_7e8,&this->super_compile_fixture,&local_12e8,iVar1);
  iVar1 = 0xee3;
  TestEq<char_const*,std::__cxx11::string>
            ("7.2",&local_7e8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xee3,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(max 1 2.0)",&local_12e9);
  compile_fixture::run_optimized(&local_808,&this->super_compile_fixture,&local_12e8,iVar1);
  iVar1 = 0xee4;
  TestEq<char_const*,std::__cxx11::string>
            ("2",&local_808,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xee4,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_808);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(max 1.0 2)",&local_12e9);
  compile_fixture::run_optimized(&local_828,&this->super_compile_fixture,&local_12e8,iVar1);
  iVar1 = 0xee5;
  TestEq<char_const*,std::__cxx11::string>
            ("2",&local_828,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xee5,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_828);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_12e8,"(max 1 2)",&local_12e9);
  compile_fixture::run_optimized(&local_848,&this->super_compile_fixture,&local_12e8,iVar1);
  iVar1 = 0xee6;
  TestEq<char_const*,std::__cxx11::string>
            ("2",&local_848,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xee6,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_848);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(max 1 2 7 -3 -11 6 3)",&local_12e9);
  compile_fixture::run_optimized(&local_868,&this->super_compile_fixture,&local_12e8,iVar1);
  iVar1 = 0xee7;
  TestEq<char_const*,std::__cxx11::string>
            ("7",&local_868,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xee7,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_868);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(min 1.0 2.0)",&local_12e9);
  compile_fixture::run_optimized(&local_888,&this->super_compile_fixture,&local_12e8,iVar1);
  iVar1 = 0xee9;
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_888,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xee9,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_888);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(min 1.0 2.0 -0.4 7.2 2.3 7.1 -11.0)",&local_12e9);
  compile_fixture::run_optimized(&local_8a8,&this->super_compile_fixture,&local_12e8,iVar1);
  iVar1 = 0xeea;
  TestEq<char_const*,std::__cxx11::string>
            ("-11",&local_8a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xeea,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_8a8);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(min 1 2.0)",&local_12e9);
  compile_fixture::run_optimized(&local_8c8,&this->super_compile_fixture,&local_12e8,iVar1);
  iVar1 = 0xeeb;
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_8c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xeeb,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(min 1.0 2)",&local_12e9);
  compile_fixture::run_optimized(&local_8e8,&this->super_compile_fixture,&local_12e8,iVar1);
  iVar1 = 0xeec;
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_8e8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xeec,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_8e8);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_12e8,"(min 1 2)",&local_12e9);
  compile_fixture::run_optimized(&local_908,&this->super_compile_fixture,&local_12e8,iVar1);
  iVar1 = 0xeed;
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_908,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xeed,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_908);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(min 1 2 7 -3 -11 6 3)",&local_12e9);
  compile_fixture::run_optimized(&local_928,&this->super_compile_fixture,&local_12e8,iVar1);
  iVar1 = 0xeee;
  TestEq<char_const*,std::__cxx11::string>
            ("-11",&local_928,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xeee,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_928);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(arithmetic-shift 1 10)",&local_12e9);
  compile_fixture::run_optimized(&local_948,&this->super_compile_fixture,&local_12e8,iVar1);
  iVar1 = 0xeef;
  TestEq<char_const*,std::__cxx11::string>
            ("1024",&local_948,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xeef,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_948);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(arithmetic-shift 255 -3)",&local_12e9);
  compile_fixture::run_optimized(&local_968,&this->super_compile_fixture,&local_12e8,iVar1);
  iVar1 = 0xef0;
  TestEq<char_const*,std::__cxx11::string>
            ("31",&local_968,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xef0,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_968);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(quotient 10 3)",&local_12e9);
  compile_fixture::run_optimized(&local_988,&this->super_compile_fixture,&local_12e8,iVar1);
  iVar1 = 0xef2;
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_988,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xef2,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_988);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(quotient -10 3)",&local_12e9);
  compile_fixture::run_optimized(&local_9a8,&this->super_compile_fixture,&local_12e8,iVar1);
  iVar1 = 0xef3;
  TestEq<char_const*,std::__cxx11::string>
            ("-3",&local_9a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xef3,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_9a8);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(quotient 10.0 3)",&local_12e9);
  compile_fixture::run_optimized(&local_9c8,&this->super_compile_fixture,&local_12e8,iVar1);
  iVar1 = 0xef4;
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_9c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xef4,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_9c8);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(quotient -10.0 3)",&local_12e9);
  compile_fixture::run_optimized(&local_9e8,&this->super_compile_fixture,&local_12e8,iVar1);
  iVar1 = 0xef5;
  TestEq<char_const*,std::__cxx11::string>
            ("-3",&local_9e8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xef5,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_9e8);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(quotient 10.0 3.0)",&local_12e9);
  compile_fixture::run_optimized(&local_a08,&this->super_compile_fixture,&local_12e8,iVar1);
  iVar1 = 0xef6;
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_a08,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xef6,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_a08);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(quotient -10.0 3.0)",&local_12e9);
  compile_fixture::run_optimized(&local_a28,&this->super_compile_fixture,&local_12e8,iVar1);
  iVar1 = 0xef7;
  TestEq<char_const*,std::__cxx11::string>
            ("-3",&local_a28,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xef7,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_a28);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(quotient 10 3.0)",&local_12e9);
  compile_fixture::run_optimized(&local_a48,&this->super_compile_fixture,&local_12e8,iVar1);
  iVar1 = 0xef8;
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_a48,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xef8,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_a48);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(quotient -10 3.0)",&local_12e9);
  compile_fixture::run_optimized(&local_a68,&this->super_compile_fixture,&local_12e8,iVar1);
  iVar1 = 0xef9;
  TestEq<char_const*,std::__cxx11::string>
            ("-3",&local_a68,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xef9,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_a68);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(remainder 10 3)",&local_12e9);
  compile_fixture::run_optimized(&local_a88,&this->super_compile_fixture,&local_12e8,iVar1);
  iVar1 = 0xefb;
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_a88,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xefb,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_a88);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(remainder -10 3)",&local_12e9);
  compile_fixture::run_optimized(&local_aa8,&this->super_compile_fixture,&local_12e8,iVar1);
  iVar1 = 0xefc;
  TestEq<char_const*,std::__cxx11::string>
            ("-1",&local_aa8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xefc,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_aa8);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(remainder 10.0 3)",&local_12e9);
  compile_fixture::run_optimized(&local_ac8,&this->super_compile_fixture,&local_12e8,iVar1);
  iVar1 = 0xefd;
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_ac8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xefd,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_ac8);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(remainder -10.0 3)",&local_12e9);
  compile_fixture::run_optimized(&local_ae8,&this->super_compile_fixture,&local_12e8,iVar1);
  iVar1 = 0xefe;
  TestEq<char_const*,std::__cxx11::string>
            ("-1",&local_ae8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xefe,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_ae8);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(remainder 10.0 3.0)",&local_12e9);
  compile_fixture::run_optimized(&local_b08,&this->super_compile_fixture,&local_12e8,iVar1);
  iVar1 = 0xeff;
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_b08,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xeff,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_b08);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(remainder -10.0 3.0)",&local_12e9);
  compile_fixture::run_optimized(&local_b28,&this->super_compile_fixture,&local_12e8,iVar1);
  iVar1 = 0xf00;
  TestEq<char_const*,std::__cxx11::string>
            ("-1",&local_b28,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf00,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_b28);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(remainder 10 3.0)",&local_12e9);
  compile_fixture::run_optimized(&local_b48,&this->super_compile_fixture,&local_12e8,iVar1);
  iVar1 = 0xf01;
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_b48,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf01,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_b48);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(remainder -10 3.0)",&local_12e9);
  compile_fixture::run_optimized(&local_b68,&this->super_compile_fixture,&local_12e8,iVar1);
  iVar1 = 0xf02;
  TestEq<char_const*,std::__cxx11::string>
            ("-1",&local_b68,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf02,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_b68);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,
             "(let ([a 1324] [b 324]) (= (+ (* (quotient a b) b)  (remainder a b) )  a)  )",
             &local_12e9);
  compile_fixture::run_optimized(&local_b88,&this->super_compile_fixture,&local_12e8,iVar1);
  iVar1 = 0xf04;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_b88,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf04,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_b88);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,
             "(let ([a 1324] [b -324.0]) (= (+ (* (quotient a b) b)  (remainder a b) )  a)  )",
             &local_12e9);
  compile_fixture::run_optimized(&local_ba8,&this->super_compile_fixture,&local_12e8,iVar1);
  iVar1 = 0xf05;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_ba8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf05,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_ba8);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(let ([a 1324] [b -324.0]) (quotient a b ))",&local_12e9);
  compile_fixture::run_optimized(&local_bc8,&this->super_compile_fixture,&local_12e8,iVar1);
  iVar1 = 0xf06;
  TestEq<char_const*,std::__cxx11::string>
            ("-4",&local_bc8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf06,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_bc8);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(let ([a 1324] [b -324.0]) (remainder a b ))",&local_12e9);
  compile_fixture::run_optimized(&local_be8,&this->super_compile_fixture,&local_12e8,iVar1);
  iVar1 = 0xf07;
  TestEq<char_const*,std::__cxx11::string>
            ("28",&local_be8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf07,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_be8);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,
             "(let ([a 1324] [b -324.0]) (+ (* (quotient a b) b)  (remainder a b) ))",&local_12e9);
  compile_fixture::run_optimized(&local_c08,&this->super_compile_fixture,&local_12e8,iVar1);
  iVar1 = 0xf08;
  TestEq<char_const*,std::__cxx11::string>
            ("1324",&local_c08,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf08,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_c08);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(modulo 10 3)",&local_12e9);
  compile_fixture::run_optimized(&local_c28,&this->super_compile_fixture,&local_12e8,iVar1);
  iVar1 = 0xf0a;
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_c28,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf0a,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_c28);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(modulo -10 3)",&local_12e9);
  compile_fixture::run_optimized(&local_c48,&this->super_compile_fixture,&local_12e8,iVar1);
  iVar1 = 0xf0b;
  TestEq<char_const*,std::__cxx11::string>
            ("2",&local_c48,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf0b,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_c48);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(modulo 10.0 3)",&local_12e9);
  compile_fixture::run_optimized(&local_c68,&this->super_compile_fixture,&local_12e8,iVar1);
  iVar1 = 0xf0c;
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_c68,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf0c,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_c68);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(modulo -10.0 -3)",&local_12e9);
  compile_fixture::run_optimized(&local_c88,&this->super_compile_fixture,&local_12e8,iVar1);
  iVar1 = 0xf0d;
  TestEq<char_const*,std::__cxx11::string>
            ("-1",&local_c88,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf0d,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_c88);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(modulo 10.0 3.0)",&local_12e9);
  compile_fixture::run_optimized(&local_ca8,&this->super_compile_fixture,&local_12e8,iVar1);
  iVar1 = 0xf0e;
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_ca8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf0e,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_ca8);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(modulo -10.0 3.0)",&local_12e9);
  compile_fixture::run_optimized(&local_cc8,&this->super_compile_fixture,&local_12e8,iVar1);
  iVar1 = 0xf0f;
  TestEq<char_const*,std::__cxx11::string>
            ("2",&local_cc8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf0f,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_cc8);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(modulo 10 -3.0)",&local_12e9);
  compile_fixture::run_optimized(&local_ce8,&this->super_compile_fixture,&local_12e8,iVar1);
  iVar1 = 0xf10;
  TestEq<char_const*,std::__cxx11::string>
            ("-2",&local_ce8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf10,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_ce8);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(modulo -10 3.0)",&local_12e9);
  compile_fixture::run_optimized(&local_d08,&this->super_compile_fixture,&local_12e8,iVar1);
  iVar1 = 0xf11;
  TestEq<char_const*,std::__cxx11::string>
            ("2",&local_d08,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf11,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_d08);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_12e8,"(abs 3)",&local_12e9);
  compile_fixture::run_optimized(&local_d28,&this->super_compile_fixture,&local_12e8,iVar1);
  iVar1 = 0xf13;
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_d28,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf13,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_d28);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_12e8,"(abs 3.2)",&local_12e9);
  compile_fixture::run_optimized(&local_d48,&this->super_compile_fixture,&local_12e8,iVar1);
  iVar1 = 0xf14;
  TestEq<char_const*,std::__cxx11::string>
            ("3.2",&local_d48,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf14,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_d48);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_12e8,"(abs -3)",&local_12e9);
  compile_fixture::run_optimized(&local_d68,&this->super_compile_fixture,&local_12e8,iVar1);
  iVar1 = 0xf15;
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_d68,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf15,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_d68);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_12e8,"(abs -3.2)",&local_12e9)
  ;
  compile_fixture::run_optimized(&local_d88,&this->super_compile_fixture,&local_12e8,iVar1);
  iVar1 = 0xf16;
  TestEq<char_const*,std::__cxx11::string>
            ("3.2",&local_d88,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf16,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_d88);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_12e8,"(abs 0)",&local_12e9);
  compile_fixture::run_optimized(&local_da8,&this->super_compile_fixture,&local_12e8,iVar1);
  iVar1 = 0xf17;
  TestEq<char_const*,std::__cxx11::string>
            ("0",&local_da8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf17,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_da8);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_12e8,"(abs 0.0)",&local_12e9);
  compile_fixture::run_optimized(&local_dc8,&this->super_compile_fixture,&local_12e8,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("0",&local_dc8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf18,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_dc8);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(inexact->exact 3.14)",&local_12e9);
  compile_fixture::run(&local_de8,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_de8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf1a,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_de8);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(inexact->exact 3)",&local_12e9);
  compile_fixture::run(&local_e08,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_e08,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf1b,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_e08);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(exact->inexact 3.14)",&local_12e9);
  compile_fixture::run(&local_e28,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("3.14",&local_e28,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf1d,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_e28);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(exact->inexact 3)",&local_12e9);
  compile_fixture::run(&local_e48,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_e48,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf1e,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_e48);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(flonum? (exact->inexact 3))",&local_12e9);
  compile_fixture::run(&local_e68,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_e68,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf1f,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_e68);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(inexact? (exact->inexact 3))",&local_12e9);
  compile_fixture::run(&local_e88,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_e88,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf20,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_e88);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(finite? 3.14)",&local_12e9);
  compile_fixture::run(&local_ea8,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_ea8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf22,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_ea8);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(finite? 2)",&local_12e9);
  compile_fixture::run(&local_ec8,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_ec8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf23,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_ec8);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(finite? (/ 1.0 0.0))",&local_12e9);
  compile_fixture::run(&local_ee8,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_ee8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf24,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_ee8);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(finite? (/ 0.0 0.0))",&local_12e9);
  compile_fixture::run(&local_f08,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_f08,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf25,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_f08);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(nan? 3.14)",&local_12e9);
  compile_fixture::run(&local_f28,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_f28,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf27,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_f28);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_12e8,"(nan? 2)",&local_12e9);
  compile_fixture::run(&local_f48,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_f48,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf28,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_f48);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(nan? (/ 1.0 0.0))",&local_12e9);
  compile_fixture::run(&local_f68,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_f68,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf29,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_f68);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(nan? (/ 0.0 0.0))",&local_12e9);
  compile_fixture::run(&local_f88,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_f88,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf2a,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_f88);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(inf? 3.14)",&local_12e9);
  compile_fixture::run(&local_fa8,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_fa8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf2c,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_fa8);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_12e8,"(inf? 2)",&local_12e9);
  compile_fixture::run(&local_fc8,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_fc8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf2d,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_fc8);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(inf? (/ 1.0 0.0))",&local_12e9);
  compile_fixture::run(&local_fe8,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_fe8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf2e,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_fe8);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(inf? (/ 0.0 0.0))",&local_12e9);
  compile_fixture::run(&local_1008,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_1008,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf2f,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_1008);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(/ 0.0 0.0)",&local_12e9);
  compile_fixture::run(&local_1028,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("-nan",&local_1028,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf34,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_1028);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(integer? 3)",&local_12e9);
  compile_fixture::run(&local_1048,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_1048,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf39,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_1048);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(integer? 3.2)",&local_12e9);
  compile_fixture::run(&local_1068,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_1068,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf3a,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_1068);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(integer? 3.0)",&local_12e9);
  compile_fixture::run(&local_1088,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_1088,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf3b,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_1088);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(ceiling 3)",&local_12e9);
  compile_fixture::run(&local_10a8,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_10a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf3d,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_10a8);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(ceiling 3.0)",&local_12e9);
  compile_fixture::run(&local_10c8,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_10c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf3e,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_10c8);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(ceiling 3.0000000001)",&local_12e9);
  compile_fixture::run(&local_10e8,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("4",&local_10e8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf3f,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_10e8);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(ceiling 2.9)",&local_12e9);
  compile_fixture::run(&local_1108,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_1108,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf40,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_1108);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(ceiling -3)",&local_12e9);
  compile_fixture::run(&local_1128,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("-3",&local_1128,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf41,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_1128);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(ceiling -3.1)",&local_12e9);
  compile_fixture::run(&local_1148,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("-3",&local_1148,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf42,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_1148);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(ceiling -2.9)",&local_12e9);
  compile_fixture::run(&local_1168,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("-2",&local_1168,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf43,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_1168);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(ceiling -2.5)",&local_12e9);
  compile_fixture::run(&local_1188,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("-2",&local_1188,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf44,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_1188);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(ceiling -2.1)",&local_12e9);
  compile_fixture::run(&local_11a8,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("-2",&local_11a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf45,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_11a8);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_12e8,"(floor 3)",&local_12e9);
  compile_fixture::run(&local_11c8,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_11c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf47,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_11c8);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(floor 3.0)",&local_12e9);
  compile_fixture::run(&local_11e8,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_11e8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf48,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_11e8);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(floor 3.0000000001)",&local_12e9);
  compile_fixture::run(&local_1208,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_1208,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf49,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_1208);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(floor 2.9)",&local_12e9);
  compile_fixture::run(&local_1228,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("2",&local_1228,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf4a,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_1228);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_12e8,"(floor -3)",&local_12e9)
  ;
  compile_fixture::run(&local_1248,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("-3",&local_1248,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf4b,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_1248);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(floor -3.1)",&local_12e9);
  compile_fixture::run(&local_1268,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("-4",&local_1268,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf4c,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_1268);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(floor -2.9)",&local_12e9);
  compile_fixture::run(&local_1288,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("-3",&local_1288,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf4d,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_1288);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(floor -2.5)",&local_12e9);
  compile_fixture::run(&local_12a8,&this->super_compile_fixture,&local_12e8,true,iVar1);
  iVar1 = 0x1c244b;
  TestEq<char_const*,std::__cxx11::string>
            ("-3",&local_12a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf4e,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_12a8);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"(floor -2.1)",&local_12e9);
  compile_fixture::run(&local_12c8,&this->super_compile_fixture,&local_12e8,true,iVar1);
  TestEq<char_const*,std::__cxx11::string>
            ("-3",&local_12c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf4f,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_12c8);
  std::__cxx11::string::~string((string *)&local_12e8);
  return;
}

Assistant:

void test()
      {
      build_libs();

      TEST_EQ("1", run("(max 1)"));
      TEST_EQ("2", run("(min 2)"));
      TEST_EQ("1.5", run("(max 1.5)"));
      TEST_EQ("2.2", run("(min 2.2)"));
      TEST_EQ("2", run("(max 1.0 2.0)"));
      TEST_EQ("7.2", run("(max 1.0 2.0 -0.4 7.2 2.3 7.1 -11.0)"));
      TEST_EQ("2", run("(max 1 2.0)"));
      TEST_EQ("2", run("(max 1.0 2)"));
      TEST_EQ("2", run("(max 1 2)"));
      TEST_EQ("7", run("(max 1 2 7 -3 -11 6 3)"));

      TEST_EQ("1", run("(min 1.0 2.0)"));
      TEST_EQ("-11", run("(min 1.0 2.0 -0.4 7.2 2.3 7.1 -11.0)"));
      TEST_EQ("1", run("(min 1 2.0)"));
      TEST_EQ("1", run("(min 1.0 2)"));
      TEST_EQ("1", run("(min 1 2)"));
      TEST_EQ("-11", run("(min 1 2 7 -3 -11 6 3)"));
      TEST_EQ("1024", run("(arithmetic-shift 1 10)"));
      TEST_EQ("31", run("(arithmetic-shift 255 -3)"));

      TEST_EQ("3", run("(quotient 10 3)"));
      TEST_EQ("-3", run("(quotient -10 3)"));
      TEST_EQ("3", run("(quotient 10.0 3)"));
      TEST_EQ("-3", run("(quotient -10.0 3)"));
      TEST_EQ("3", run("(quotient 10.0 3.0)"));
      TEST_EQ("-3", run("(quotient -10.0 3.0)"));
      TEST_EQ("3", run("(quotient 10 3.0)"));
      TEST_EQ("-3", run("(quotient -10 3.0)"));

      TEST_EQ("1", run("(remainder 10 3)"));
      TEST_EQ("-1", run("(remainder -10 3)"));
      TEST_EQ("1", run("(remainder 10.0 3)"));
      TEST_EQ("-1", run("(remainder -10.0 3)"));
      TEST_EQ("1", run("(remainder 10.0 3.0)"));
      TEST_EQ("-1", run("(remainder -10.0 3.0)"));
      TEST_EQ("1", run("(remainder 10 3.0)"));
      TEST_EQ("-1", run("(remainder -10 3.0)"));


      TEST_EQ("#t", run("(let ([a 1324] [b 324]) (= (+ (* (quotient a b) b)  (remainder a b) )  a)  )"));
      TEST_EQ("#t", run("(let ([a 1324] [b -324.0]) (= (+ (* (quotient a b) b)  (remainder a b) )  a)  )"));
      TEST_EQ("-4", run("(let ([a 1324] [b -324.0]) (quotient a b ))"));
      TEST_EQ("28", run("(let ([a 1324] [b -324.0]) (remainder a b ))"));
      TEST_EQ("1324", run("(let ([a 1324] [b -324.0]) (+ (* (quotient a b) b)  (remainder a b) ))"));

      TEST_EQ("1", run("(modulo 10 3)"));
      TEST_EQ("2", run("(modulo -10 3)"));
      TEST_EQ("1", run("(modulo 10.0 3)"));
      TEST_EQ("-1", run("(modulo -10.0 -3)"));
      TEST_EQ("1", run("(modulo 10.0 3.0)"));
      TEST_EQ("2", run("(modulo -10.0 3.0)"));
      TEST_EQ("-2", run("(modulo 10 -3.0)"));
      TEST_EQ("2", run("(modulo -10 3.0)"));

      TEST_EQ("3", run("(abs 3)"));
      TEST_EQ("3.2", run("(abs 3.2)"));
      TEST_EQ("3", run("(abs -3)"));
      TEST_EQ("3.2", run("(abs -3.2)"));
      TEST_EQ("0", run("(abs 0)"));
      TEST_EQ("0", run("(abs 0.0)"));

      TEST_EQ("3", run("(flonum->fixnum 3.143)"));
      TEST_EQ("-3", run("(flonum->fixnum -3.143)"));

      TEST_EQ("3", run("(fixnum->flonum 3)"));
      TEST_EQ("#t", run("(flonum? (fixnum->flonum 3))"));

      TEST_EQ("1", run_optimized("(max 1)"));
      TEST_EQ("2", run_optimized("(min 2)"));
      TEST_EQ("1.5", run_optimized("(max 1.5)"));
      TEST_EQ("2.2", run_optimized("(min 2.2)"));
      TEST_EQ("2", run_optimized("(max 1.0 2.0)"));
      TEST_EQ("7.2", run_optimized("(max 1.0 2.0 -0.4 7.2 2.3 7.1 -11.0)"));
      TEST_EQ("2", run_optimized("(max 1 2.0)"));
      TEST_EQ("2", run_optimized("(max 1.0 2)"));
      TEST_EQ("2", run_optimized("(max 1 2)"));
      TEST_EQ("7", run_optimized("(max 1 2 7 -3 -11 6 3)"));

      TEST_EQ("1", run_optimized("(min 1.0 2.0)"));
      TEST_EQ("-11", run_optimized("(min 1.0 2.0 -0.4 7.2 2.3 7.1 -11.0)"));
      TEST_EQ("1", run_optimized("(min 1 2.0)"));
      TEST_EQ("1", run_optimized("(min 1.0 2)"));
      TEST_EQ("1", run_optimized("(min 1 2)"));
      TEST_EQ("-11", run_optimized("(min 1 2 7 -3 -11 6 3)"));
      TEST_EQ("1024", run_optimized("(arithmetic-shift 1 10)"));
      TEST_EQ("31", run_optimized("(arithmetic-shift 255 -3)"));

      TEST_EQ("3", run_optimized("(quotient 10 3)"));
      TEST_EQ("-3", run_optimized("(quotient -10 3)"));
      TEST_EQ("3", run_optimized("(quotient 10.0 3)"));
      TEST_EQ("-3", run_optimized("(quotient -10.0 3)"));
      TEST_EQ("3", run_optimized("(quotient 10.0 3.0)"));
      TEST_EQ("-3", run_optimized("(quotient -10.0 3.0)"));
      TEST_EQ("3", run_optimized("(quotient 10 3.0)"));
      TEST_EQ("-3", run_optimized("(quotient -10 3.0)"));

      TEST_EQ("1", run_optimized("(remainder 10 3)"));
      TEST_EQ("-1", run_optimized("(remainder -10 3)"));
      TEST_EQ("1", run_optimized("(remainder 10.0 3)"));
      TEST_EQ("-1", run_optimized("(remainder -10.0 3)"));
      TEST_EQ("1", run_optimized("(remainder 10.0 3.0)"));
      TEST_EQ("-1", run_optimized("(remainder -10.0 3.0)"));
      TEST_EQ("1", run_optimized("(remainder 10 3.0)"));
      TEST_EQ("-1", run_optimized("(remainder -10 3.0)"));

      TEST_EQ("#t", run_optimized("(let ([a 1324] [b 324]) (= (+ (* (quotient a b) b)  (remainder a b) )  a)  )"));
      TEST_EQ("#t", run_optimized("(let ([a 1324] [b -324.0]) (= (+ (* (quotient a b) b)  (remainder a b) )  a)  )"));
      TEST_EQ("-4", run_optimized("(let ([a 1324] [b -324.0]) (quotient a b ))"));
      TEST_EQ("28", run_optimized("(let ([a 1324] [b -324.0]) (remainder a b ))"));
      TEST_EQ("1324", run_optimized("(let ([a 1324] [b -324.0]) (+ (* (quotient a b) b)  (remainder a b) ))"));

      TEST_EQ("1", run_optimized("(modulo 10 3)"));
      TEST_EQ("2", run_optimized("(modulo -10 3)"));
      TEST_EQ("1", run_optimized("(modulo 10.0 3)"));
      TEST_EQ("-1", run_optimized("(modulo -10.0 -3)"));
      TEST_EQ("1", run_optimized("(modulo 10.0 3.0)"));
      TEST_EQ("2", run_optimized("(modulo -10.0 3.0)"));
      TEST_EQ("-2", run_optimized("(modulo 10 -3.0)"));
      TEST_EQ("2", run_optimized("(modulo -10 3.0)"));

      TEST_EQ("3", run_optimized("(abs 3)"));
      TEST_EQ("3.2", run_optimized("(abs 3.2)"));
      TEST_EQ("3", run_optimized("(abs -3)"));
      TEST_EQ("3.2", run_optimized("(abs -3.2)"));
      TEST_EQ("0", run_optimized("(abs 0)"));
      TEST_EQ("0", run_optimized("(abs 0.0)"));

      TEST_EQ("3", run("(inexact->exact 3.14)"));
      TEST_EQ("3", run("(inexact->exact 3)"));

      TEST_EQ("3.14", run("(exact->inexact 3.14)"));
      TEST_EQ("3", run("(exact->inexact 3)"));
      TEST_EQ("#t", run("(flonum? (exact->inexact 3))"));
      TEST_EQ("#t", run("(inexact? (exact->inexact 3))"));

      TEST_EQ("#t", run("(finite? 3.14)"));
      TEST_EQ("#t", run("(finite? 2)"));
      TEST_EQ("#f", run("(finite? (/ 1.0 0.0))"));
      TEST_EQ("#f", run("(finite? (/ 0.0 0.0))"));

      TEST_EQ("#f", run("(nan? 3.14)"));
      TEST_EQ("#f", run("(nan? 2)"));
      TEST_EQ("#f", run("(nan? (/ 1.0 0.0))"));
      TEST_EQ("#t", run("(nan? (/ 0.0 0.0))"));

      TEST_EQ("#f", run("(inf? 3.14)"));
      TEST_EQ("#f", run("(inf? 2)"));
      TEST_EQ("#t", run("(inf? (/ 1.0 0.0))"));
      TEST_EQ("#f", run("(inf? (/ 0.0 0.0))"));

#ifdef _WIN32
      TEST_EQ("-nan(ind)", run("(/ 0.0 0.0)"));
#elif defined(unix)
      TEST_EQ("-nan", run("(/ 0.0 0.0)"));
#else
      TEST_EQ("nan", run("(/ 0.0 0.0)"));
#endif

      TEST_EQ("#t", run("(integer? 3)"));
      TEST_EQ("#f", run("(integer? 3.2)"));
      TEST_EQ("#t", run("(integer? 3.0)"));

      TEST_EQ("3", run("(ceiling 3)"));
      TEST_EQ("3", run("(ceiling 3.0)"));
      TEST_EQ("4", run("(ceiling 3.0000000001)"));
      TEST_EQ("3", run("(ceiling 2.9)"));
      TEST_EQ("-3", run("(ceiling -3)"));
      TEST_EQ("-3", run("(ceiling -3.1)"));
      TEST_EQ("-2", run("(ceiling -2.9)"));
      TEST_EQ("-2", run("(ceiling -2.5)"));
      TEST_EQ("-2", run("(ceiling -2.1)"));

      TEST_EQ("3", run("(floor 3)"));
      TEST_EQ("3", run("(floor 3.0)"));
      TEST_EQ("3", run("(floor 3.0000000001)"));
      TEST_EQ("2", run("(floor 2.9)"));
      TEST_EQ("-3", run("(floor -3)"));
      TEST_EQ("-4", run("(floor -3.1)"));
      TEST_EQ("-3", run("(floor -2.9)"));
      TEST_EQ("-3", run("(floor -2.5)"));
      TEST_EQ("-3", run("(floor -2.1)"));
      }